

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool __thiscall
SingleNodeColumnSampler<double,_double>::sample_col
          (SingleNodeColumnSampler<double,_double> *this,size_t *col_chosen,
          Xoshiro256PP *rnd_generator)

{
  bool bVar1;
  double *pdVar2;
  runtime_error *this_00;
  result_type __n;
  reference pvVar3;
  reference __b;
  reference pvVar4;
  value_type *in_RSI;
  size_type __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  result_type_conflict1 rVar5;
  double dVar6;
  size_t lev_1;
  size_t lev;
  double curr_subrange;
  double w_left;
  double rnd_subrange;
  size_t curr_ix;
  size_t chosen_2;
  size_t col_2;
  double cumw_;
  double chosen;
  size_t col_1;
  size_t col;
  size_t curr;
  size_t chosen_1;
  Xoshiro256PP *in_stack_fffffffffffffd78;
  value_type vVar7;
  uniform_real_distribution<double> *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd98;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  ulong uVar8;
  int in_stack_fffffffffffffdcc;
  ulong local_228;
  size_type local_208;
  ulong local_1e8;
  double local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_111 [4];
  string local_90 [32];
  ulong local_70;
  reference local_68;
  reference local_58;
  ulong local_48;
  result_type local_40;
  result_type local_28;
  value_type *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  if ((in_RDI[2].field_2._M_local_buf[0] & 1U) == 0) {
    if ((in_RDI[2].field_2._M_local_buf[1] & 1U) != 0) {
      pdVar2 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x222a2f);
      *(double **)in_RDI = pdVar2;
    }
    if (*(long *)((long)&in_RDI[1].field_2 + 8) != 0) {
      std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffd80,
                 (unsigned_long)in_stack_fffffffffffffd78,0x222a68);
      local_28 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffd80,
                            in_stack_fffffffffffffd78);
      local_40 = 0;
      for (local_48 = 0; local_48 < in_RDI[2]._M_string_length; local_48 = local_48 + 1) {
        local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
        local_40 = bVar1 + local_40;
        if (local_40 == local_28) {
          *local_18 = *(value_type *)(*(long *)(in_RDI + 2) + local_48 * 8);
          *(long *)((long)&in_RDI[1].field_2 + 8) = *(long *)((long)&in_RDI[1].field_2 + 8) + -1;
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          std::_Bit_reference::operator=(&local_68,false);
          in_RDI[3].field_2._M_allocated_capacity = in_RDI[3].field_2._M_allocated_capacity - 1;
          return true;
        }
      }
    }
    if (in_RDI[3].field_2._M_allocated_capacity == 0) {
      local_1 = false;
    }
    else {
      if (*(double *)&in_RDI[1].field_2 <= 0.0) {
        in_RDI[1].field_2._M_allocated_capacity = 0;
        for (local_70 = 0; local_70 < in_RDI[2]._M_string_length; local_70 = local_70 + 1) {
          *(double *)&in_RDI[1].field_2 =
               *(double *)(*(long *)in_RDI + *(long *)(*(long *)(in_RDI + 2) + local_70 * 8) * 8) +
               *(double *)&in_RDI[1].field_2;
        }
        if (*(double *)&in_RDI[1].field_2 <= 0.0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          __rhs = local_111;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdc0,(char *)in_RDI,(allocator<char> *)__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdc0,(char *)in_RDI,(allocator<char> *)__rhs);
          std::operator+(in_RDI,__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdc0,(char *)in_RDI,(allocator<char> *)__rhs);
          std::operator+(in_RDI,__rhs);
          std::__cxx11::to_string(in_stack_fffffffffffffdcc);
          std::operator+(in_RDI,__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdc0,(char *)in_RDI,(allocator<char> *)__rhs);
          std::operator+(in_RDI,__rhs);
          std::runtime_error::runtime_error(this_00,local_90);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::uniform_real_distribution<double>::uniform_real_distribution
                (in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78,1.1069259177655e-317);
      rVar5 = std::uniform_real_distribution<double>::operator()
                        (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_1e0 = 0.0;
      for (local_1e8 = 0; local_1e8 < in_RDI[2]._M_string_length; local_1e8 = local_1e8 + 1) {
        local_1e0 = *(double *)
                     (*(long *)in_RDI + *(long *)(*(long *)(in_RDI + 2) + local_1e8 * 8) * 8) +
                    local_1e0;
        if (rVar5 <= local_1e0) {
          *local_18 = *(value_type *)(*(long *)(in_RDI + 2) + local_1e8 * 8);
          *(double *)&in_RDI[1].field_2 =
               *(double *)&in_RDI[1].field_2 - *(double *)(*(long *)in_RDI + *local_18 * 8);
          *(undefined8 *)(*(long *)in_RDI + *local_18 * 8) = 0;
          in_RDI[3].field_2._M_allocated_capacity = in_RDI[3].field_2._M_allocated_capacity - 1;
          return true;
        }
      }
      *local_18 = *(value_type *)(*(long *)(in_RDI + 2) + (in_RDI[2]._M_string_length - 1) * 8);
      *(double *)&in_RDI[1].field_2 =
           *(double *)&in_RDI[1].field_2 - *(double *)(*(long *)in_RDI + *local_18 * 8);
      *(undefined8 *)(*(long *)in_RDI + *local_18 * 8) = 0;
      in_RDI[3].field_2._M_allocated_capacity = in_RDI[3].field_2._M_allocated_capacity - 1;
      local_1 = true;
    }
  }
  else if (*(long *)((long)&in_RDI[1].field_2 + 8) == 0) {
    if (in_RDI[3].field_2._M_allocated_capacity == 0) {
      local_1 = false;
    }
    else {
      local_208 = 0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)&in_RDI[3].field_2 + 8),
                          0);
      if (0.0 < *pvVar4) {
        for (local_228 = 0; local_228 < *(ulong *)((long)&in_RDI[4].field_2 + 8);
            local_228 = local_228 + 1) {
          std::uniform_real_distribution<double>::uniform_real_distribution
                    (in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78,
                     1.1072999254594e-317);
          rVar5 = std::uniform_real_distribution<double>::operator()
                            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&in_RDI[3].field_2 + 8),local_208 * 2 + 1);
          local_208 = local_208 * 2 + 1 + (ulong)(*pvVar4 <= rVar5);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)((long)&in_RDI[3].field_2 + 8),
                     local_208);
        }
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            ((long)&in_RDI[5].field_2 + 8),
                            local_208 - in_RDI[4].field_2._M_allocated_capacity);
        *local_18 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            ((long)&in_RDI[3].field_2 + 8),local_208);
        *pvVar4 = 0.0;
        for (uVar8 = 0; uVar8 < *(ulong *)((long)&in_RDI[4].field_2 + 8); uVar8 = uVar8 + 1) {
          local_208 = local_208 - 1 >> 1;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&in_RDI[3].field_2 + 8),local_208 * 2 + 1);
          vVar7 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&in_RDI[3].field_2 + 8),local_208 * 2 + 2);
          dVar6 = vVar7 + *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&in_RDI[3].field_2 + 8),local_208);
          *pvVar4 = dVar6;
        }
        in_RDI[3].field_2._M_allocated_capacity = in_RDI[3].field_2._M_allocated_capacity - 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffd80,
               (unsigned_long)in_stack_fffffffffffffd78,0x223174);
    __n = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffd80,
                     in_stack_fffffffffffffd78);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[6].field_2,
                        __n);
    *local_18 = *pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[6].field_2,
                        __n);
    __n_00 = *(long *)((long)&in_RDI[1].field_2 + 8) - 1;
    *(size_type *)((long)&in_RDI[1].field_2 + 8) = __n_00;
    __b = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[6].field_2,
                     __n_00);
    std::swap<unsigned_long>(pvVar3,__b);
    in_RDI[3].field_2._M_allocated_capacity = in_RDI[3].field_2._M_allocated_capacity - 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::sample_col(size_t &col_chosen, RNG_engine &rnd_generator)
{
    if (!this->using_tree)
    {
        if (this->backup_weights)
            this->weights_orig = this->weights_own.data();

        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            size_t curr = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                curr += inifinite_weights[this->col_indices[col]];
                if (curr == chosen)
                {
                    col_chosen = this->col_indices[col];
                    this->n_inf--;
                    this->inifinite_weights[col_chosen] = false;
                    this->n_left--;
                    return true;
                }
            }
            assert(0);
        }

        if (!this->n_left) return false;

        /* due to the way this is calculated, there can be large roundoff errors and even negatives */
        if (this->cumw <= 0)
        {
            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
                this->cumw += this->weights_orig[this->col_indices[col]];
            if (unlikely(this->cumw <= 0))
                unexpected_error();
        }

        /* if there are no infinites, choose a column according to weight */
        ldouble_safe chosen = std::uniform_real_distribution<ldouble_safe>((ldouble_safe)0, this->cumw)(rnd_generator);
        ldouble_safe cumw_ = 0;
        for (size_t col = 0; col < this->curr_pos; col++)
        {
            cumw_ += this->weights_orig[this->col_indices[col]];
            if (cumw_ >= chosen)
            {
                col_chosen = this->col_indices[col];
                this->cumw -= this->weights_orig[col_chosen];
                this->weights_orig[col_chosen] = 0;
                this->n_left--;
                return true;
            }
        }
        col_chosen = this->col_indices[this->curr_pos-1];
        this->cumw -= this->weights_orig[col_chosen];
        this->weights_orig[col_chosen] = 0;
        this->n_left--;
        return true;
    }

    else
    {
        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            col_chosen = this->mapped_inf_indices[chosen];
            std::swap(this->mapped_inf_indices[chosen], this->mapped_inf_indices[--this->n_inf]);
            this->n_left--;
            return true;
        }

        else
        {
            /* TODO: should standardize all these tree traversals into one.
               This one in particular could do with sampling only a single
               random number as it will not typically require exhausting all
               options like the usual column sampler. */
            if (!this->n_left) return false;
            size_t curr_ix = 0;
            double rnd_subrange, w_left;
            double curr_subrange = this->tree_weights[0];
            if (curr_subrange <= 0)
                return false;

            for (size_t lev = 0; lev < tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = this->tree_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = this->tree_weights[curr_ix];
            }

            col_chosen = this->mapped_indices[curr_ix - this->offset];

            this->tree_weights[curr_ix] = 0.;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                this->tree_weights[curr_ix] =   this->tree_weights[ix_child(curr_ix)]
                                              + this->tree_weights[ix_child(curr_ix) + 1];
            }
            
            this->n_left--;
            return true;
        }
    }
}